

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O1

int __thiscall NetOptimize::eliminate_flatten_after_innerproduct(NetOptimize *this)

{
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **ppvVar1;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar2;
  Layer *pLVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  pvVar2 = (this->super_ModelWriter).layers;
  lVar7 = (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar7 != 0) {
    ppvVar1 = &(this->super_ModelWriter).layers;
    uVar8 = lVar7 >> 3;
    lVar7 = 0;
    do {
      iVar5 = std::__cxx11::string::compare
                        ((char *)&((*ppvVar1)->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[lVar7]->type);
      if (iVar5 == 0) {
        uVar9 = lVar7 + 1;
        uVar10 = uVar9;
        if (uVar9 < uVar8) {
          iVar5 = *(((*ppvVar1)->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                    _M_impl.super__Vector_impl_data._M_start[lVar7]->tops).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          do {
            iVar6 = std::__cxx11::string::compare
                              ((char *)&((*ppvVar1)->
                                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                        )._M_impl.super__Vector_impl_data._M_start[uVar9]->type);
            if (((iVar6 == 0) &&
                (pLVar3 = ((*ppvVar1)->
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                          .super__Vector_impl_data._M_start[uVar9],
                piVar4 = (pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                (long)*(pointer *)
                       ((long)&(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl + 8) - (long)piVar4 == 4)) &&
               (uVar10 = uVar9, *piVar4 == iVar5)) break;
            uVar9 = uVar9 + 1;
            uVar10 = uVar8;
          } while (uVar9 < uVar8);
        }
        if (uVar10 != uVar8) {
          eliminate_flatten_after_innerproduct();
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != uVar8 + (uVar8 == 0));
  }
  return 0;
}

Assistant:

int NetOptimize::eliminate_flatten_after_innerproduct()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "InnerProduct")
            continue;

        // InnerProduct - Flatten
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "Flatten")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        ncnn::InnerProduct* innerproduct = (ncnn::InnerProduct*)layers[i];
        ncnn::Flatten* flatten = (ncnn::Flatten*)layers[j];

        fprintf(stderr, "eliminate_flatten_after_innerproduct %s %s\n", innerproduct->name.c_str(), flatten->name.c_str());

        int top_blob_index_final = flatten->tops[0];
        innerproduct->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        flatten->type = "ncnnfused";
    }

    return 0;
}